

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall
SVGChart::LineDataDrawer::DrawData
          (LineDataDrawer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          PlotDataSelection *inPlotDataSelection,AxisSetup *inXAxisSetup,PRect *inRect,
          Painter *inPainter)

{
  pointer piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined4 extraout_var;
  long lVar7;
  uint uVar8;
  bool bVar9;
  Trafo *pTVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar11;
  long theEnd;
  long theStart;
  float local_84;
  long local_40;
  long local_38;
  
  if ((this->super_DataDrawerBase).mXTrafo == (Trafo *)0x0) {
    return false;
  }
  if ((((this->super_DataDrawerBase).mYTrafo != (Trafo *)0x0) &&
      (lVar5 = PlotDataBase::GetSize(inXData), lVar5 != 0)) &&
     (lVar5 = PlotDataBase::GetSize(inYData), lVar5 != 0)) {
    lVar5 = PlotDataBase::GetSize(inXData);
    lVar6 = PlotDataBase::GetSize(inYData);
    if (lVar5 <= lVar6) {
      (*inPainter->_vptr_Painter[0xc])(inPainter,&this->mStyle);
      local_38 = 0;
      lVar5 = PlotDataBase::GetSize(inXData);
      lVar5 = lVar5 + -1;
      local_40 = lVar5;
      if ((this->super_DataDrawerBase).mDrawFast == true) {
        FindRange(inXData,inXAxisSetup->mMin,inXAxisSetup->mMax,&local_38,&local_40);
        lVar6 = local_38;
        lVar5 = local_40;
        lVar7 = local_40 - local_38;
        iVar2 = (*inPainter->_vptr_Painter[4])(inPainter);
        uVar3 = (uint)((lVar7 + 1) / CONCAT44(extraout_var,iVar2));
        uVar8 = 1;
        if (1 < uVar3) {
          uVar8 = uVar3;
        }
        lVar6 = (long)(int)lVar6;
      }
      else {
        uVar8 = 1;
        lVar6 = 0;
      }
      if (lVar5 < lVar6) {
        return true;
      }
      iVar2 = uVar8 + (int)lVar6 + -1;
      fVar11 = 0.0;
      bVar9 = true;
      local_84 = 0.0;
      while( true ) {
        pTVar10 = (this->super_DataDrawerBase).mXTrafo;
        PlotDataBase::GetValue(inXData,lVar6);
        (*pTVar10->_vptr_Trafo[2])(pTVar10);
        if ((int)uVar8 < 2) {
          pTVar10 = (this->super_DataDrawerBase).mYTrafo;
          PlotDataBase::GetValue(inYData,lVar6);
        }
        else {
          lVar7 = (long)iVar2;
          if (lVar5 < iVar2) {
            lVar7 = lVar5;
          }
          pTVar10 = (this->super_DataDrawerBase).mYTrafo;
          GetMaxFromRange(inYData,lVar6,lVar7);
        }
        (*pTVar10->_vptr_Trafo[2])(pTVar10);
        if ((!bVar9) && ((this->super_DataDrawerBase).field_0x24 == '\x01')) {
          (**inPainter->_vptr_Painter)
                    (local_84,fVar11,extraout_XMM0_Da,extraout_XMM0_Da_00,inPainter);
        }
        if ((((this->super_DataDrawerBase).field_0x25 == '\x01') &&
            (iVar4 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[4])
                               (this,(ulong)(uint)(int)extraout_XMM0_Da,
                                (ulong)(uint)(int)extraout_XMM0_Da_00,inRect,inPainter),
            (char)iVar4 == '\0')) ||
           ((piVar1 = (inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,
            lVar6 < (long)(inPlotDataSelection->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar1 >> 2 &&
            ((0 < piVar1[lVar6] &&
             (iVar4 = (*(this->super_DataDrawerBase)._vptr_DataDrawerBase[5])
                                (this,(ulong)(uint)(int)extraout_XMM0_Da,
                                 (ulong)(uint)(int)extraout_XMM0_Da_00,inRect,inPainter),
             (char)iVar4 == '\0')))))) break;
        lVar6 = lVar6 + (int)uVar8;
        iVar2 = iVar2 + uVar8;
        bVar9 = false;
        fVar11 = extraout_XMM0_Da_00;
        local_84 = extraout_XMM0_Da;
        if (lVar5 < lVar6) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool LineDataDrawer::DrawData (const PlotDataBase &inXData, const PlotDataBase &inYData, const PlotDataSelection &inPlotDataSelection, const AxisSetup &inXAxisSetup, const PRect &inRect, Painter &inPainter) const {
      if (!mXTrafo || !mYTrafo) {
        return false;
      }
      if ((inXData.GetSize () == 0) || (inYData.GetSize () == 0)) {
          return false;
      }
      long theXSize = inXData.GetSize ();
      long theYSize = inYData.GetSize ();
      if (theXSize>theYSize) {
        return false;
      }
      inPainter.SetStyle (mStyle);
      float thePrevX = 0;
      float thePrevY = 0;
      bool theFirst = true;
      float theTraX, theTraY;

      long theStart = 0;
      long theEnd = inXData.GetSize () - 1;
      int theStride = 1;
      if (mDrawFast) {
          FindRange (inXData, inXAxisSetup.mMin, inXAxisSetup.mMax, theStart, theEnd);

          theStride = (theEnd - theStart + 1) / inPainter.GetWidth ();
          if (theStride == 0) {
              theStride = 1;
          }
      }


      for (int theI = theStart; theI <= theEnd; theI+=theStride) {

        theTraX = mXTrafo->Transform (inXData.GetValue (theI));
        if (theStride > 1) {
          long theLast = theI + theStride - 1;
          if (theLast>theEnd) {
            theLast = theEnd;
          }
            theTraY = mYTrafo->Transform (GetMaxFromRange (inYData, theI, theLast));
        }
        else {
            theTraY = mYTrafo->Transform (inYData.GetValue (theI));
        }

        if (!theFirst && mDrawLine) {
          inPainter.DrawLine (thePrevX, thePrevY, theTraX, theTraY);
        }
        else {
          theFirst = false;
        }
        bool theDrawPoint = mDrawPoint;

        if (theDrawPoint && !DrawPoint (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        if (inPlotDataSelection.IsSelected (theI) && !DrawSelection (theTraX, theTraY, inRect, inPainter)) {
          return false;
        }
        thePrevX = theTraX;
        thePrevY = theTraY;
      }
      return true;
    }